

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::NamedValueType::NamedValueType(NamedValueType *this)

{
  NamedValueType *pNVar1;
  NamedValueType *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NamedValueType_00631be8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  pNVar1 = internal_default_instance();
  if (this != pNVar1) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

NamedValueType::NamedValueType()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.MILSpec.NamedValueType)
}